

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::setSelection(QTableView *this,QRect *rect,SelectionFlags command)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  LayoutDirection LVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined8 *puVar17;
  undefined1 **ppuVar18;
  ulong uVar19;
  int iVar20;
  QTableViewPrivate *pQVar21;
  QHeaderView *this_00;
  long *plVar22;
  long in_FS_OFFSET;
  SpanList *__range3;
  ulong local_120;
  QModelIndex local_f0;
  QModelIndex local_d8;
  QModelIndex local_b8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  LVar8 = QWidget::layoutDirection((QWidget *)this);
  iVar10 = (rect->x1).m_i;
  if (LVar8 == RightToLeft) {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
    local_b8.r = (rect->x2).m_i;
    puVar17 = &local_98.d;
    if (iVar10 < local_b8.r) {
      puVar17 = (undefined8 *)&local_b8;
    }
  }
  else {
    local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
    local_b8.r = (rect->x2).m_i;
    puVar17 = (undefined8 *)&local_b8;
    if (iVar10 < local_b8.r) {
      puVar17 = &local_98.d;
    }
  }
  local_98.d = (Data *)CONCAT44(local_98.d._4_4_,iVar10);
  iVar10 = (rect->y1).m_i;
  local_78.c = (rect->y2).m_i;
  if (iVar10 < local_78.c) {
    local_78.c = iVar10;
  }
  local_78.r = *(int *)puVar17;
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_58,this,&local_78);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  LVar8 = QWidget::layoutDirection((QWidget *)this);
  local_b8.r = (rect->x1).m_i;
  if (LVar8 == RightToLeft) {
    local_d8.r = (rect->x2).m_i;
    ppuVar18 = (undefined1 **)&local_d8;
    if (local_b8.r < local_d8.r) {
      ppuVar18 = (undefined1 **)&local_b8;
    }
  }
  else {
    local_d8.r = (rect->x2).m_i;
    ppuVar18 = (undefined1 **)&local_b8;
    if (local_b8.r < local_d8.r) {
      ppuVar18 = (undefined1 **)&local_d8;
    }
  }
  iVar10 = (rect->y1).m_i;
  iVar9 = (rect->y2).m_i;
  if (iVar9 < iVar10) {
    iVar9 = iVar10;
  }
  local_98.d = (Data *)CONCAT44(iVar9,*(undefined4 *)ppuVar18);
  (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget + 0x1f0))(&local_78,this);
  if (((((((*(long *)(lVar2 + 800) == 0) || (*(int *)(*(long *)(lVar2 + 800) + 4) == 0)) ||
         (*(long *)(lVar2 + 0x328) == 0)) || ((local_58.r < 0 || ((long)local_58._0_8_ < 0)))) ||
       ((local_58.m.ptr == (QAbstractItemModel *)0x0 ||
        ((local_78.r < 0 || ((long)local_78._0_8_ < 0)))))) ||
      (local_78.m.ptr == (QAbstractItemModel *)0x0)) ||
     ((uVar19 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                          (*(long **)(lVar2 + 0x2f8),&local_58), (uVar19 & 0x20) == 0 ||
      (uVar19 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                          (*(long **)(lVar2 + 0x2f8),&local_78), (uVar19 & 0x20) == 0))))
  goto LAB_00594cc9;
  bVar4 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x588));
  bVar5 = QHeaderView::sectionsMoved
                    (*(QHeaderView **)
                      (*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                 super_QFrame.super_QWidget.field_0x8 + 0x580));
  local_98.d = (Data *)0x0;
  local_98.ptr = (QItemSelectionRange *)0x0;
  local_98.size = 0;
  plVar1 = (long *)(lVar2 + 0x650);
  if (*(long **)(lVar2 + 0x650) == plVar1) {
    if (bVar4 && bVar5) {
      iVar10 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
      uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
      local_120 = (ulong)uVar12;
      this_00 = *(QHeaderView **)(lVar2 + 0x580);
    }
    else {
      local_120 = local_78._0_8_ & 0xffffffff;
      iVar10 = local_58.r;
      if (!bVar5) {
        if (bVar4) {
          iVar10 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
          uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
          local_120 = (ulong)uVar12;
        }
        uVar19 = (ulong)(uint)local_58.c;
        iVar9 = local_78.c;
        goto LAB_005947b9;
      }
      this_00 = *(QHeaderView **)(lVar2 + 0x580);
    }
    uVar12 = QHeaderView::visualIndex(this_00,local_58.c);
    uVar19 = (ulong)uVar12;
    iVar9 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
  }
  else {
    iVar9 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
    iVar10 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
    if (iVar9 < iVar10) {
      iVar10 = iVar9;
    }
    uVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
    uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
    if ((int)uVar11 < (int)uVar12) {
      uVar12 = uVar11;
    }
    uVar19 = (ulong)uVar12;
    uVar11 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_58.r);
    uVar12 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),local_78.r);
    if ((int)uVar12 < (int)uVar11) {
      uVar12 = uVar11;
    }
    local_120 = (ulong)uVar12;
    iVar13 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_58.c);
    iVar9 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),local_78.c);
    if (iVar9 < iVar13) {
      iVar9 = iVar13;
    }
    bVar6 = false;
    do {
      plVar22 = (long *)*plVar1;
      if (plVar22 == plVar1) {
        iVar13 = 0;
      }
      else {
        iVar13 = 0;
        do {
          piVar3 = (int *)plVar22[2];
          iVar14 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x588),*piVar3);
          pQVar21 = *(QTableViewPrivate **)(lVar2 + 0x580);
          uVar12 = QHeaderView::visualIndex((QHeaderView *)pQVar21,piVar3[1]);
          iVar15 = QTableViewPrivate::sectionSpanEndLogical
                             (pQVar21,*(QHeaderView **)(lVar2 + 0x588),*piVar3,
                              (piVar3[2] - *piVar3) + 1);
          pQVar21 = *(QTableViewPrivate **)(lVar2 + 0x588);
          uVar11 = QHeaderView::visualIndex((QHeaderView *)pQVar21,iVar15);
          iVar15 = QTableViewPrivate::sectionSpanEndLogical
                             (pQVar21,*(QHeaderView **)(lVar2 + 0x580),piVar3[1],
                              (piVar3[3] - piVar3[1]) + 1);
          iVar15 = QHeaderView::visualIndex(*(QHeaderView **)(lVar2 + 0x580),iVar15);
          iVar20 = 5;
          if ((((iVar14 <= (int)local_120) && ((int)uVar12 <= iVar9)) && (iVar10 <= (int)uVar11)) &&
             ((int)uVar19 <= iVar15)) {
            iVar16 = iVar10;
            if (iVar14 < iVar10) {
              iVar16 = iVar14;
            }
            if (iVar14 < iVar10) {
              iVar13 = 1;
            }
            if ((int)uVar12 < (int)uVar19) {
              uVar19 = (ulong)uVar12;
              iVar13 = 1;
            }
            if ((int)local_120 < (int)uVar11) {
              local_120 = (ulong)uVar11;
              iVar13 = 1;
            }
            if (iVar9 < iVar15) {
              iVar13 = 1;
              iVar9 = iVar15;
            }
            iVar20 = iVar13 << 2;
            bVar6 = true;
            iVar10 = iVar16;
          }
        } while (((iVar20 == 5) || (iVar20 == 0)) && (plVar22 = (long *)*plVar22, plVar22 != plVar1)
                );
      }
    } while (iVar13 != 0);
    if (bVar6) {
      if ((!bVar4) && (!bVar5)) {
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar10,uVar19,&local_d8);
        local_58.m.ptr = local_b8.m.ptr;
        local_58.r = local_b8.r;
        local_58.c = local_b8.c;
        local_58.i = local_b8.i;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,local_120,iVar9,&local_d8);
        local_78.m.ptr = local_b8.m.ptr;
        local_78.r = local_b8.r;
        local_78.c = local_b8.c;
        local_78.i = local_b8.i;
      }
    }
    else {
      uVar19 = (ulong)local_58._0_8_ >> 0x20;
      local_120 = local_78._0_8_ & 0xffffffff;
      iVar10 = local_58.r;
      iVar9 = local_78.c;
    }
  }
LAB_005947b9:
  iVar14 = (int)uVar19;
  iVar13 = (int)local_120;
  if (bVar4 && bVar5) {
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)&local_98,
               (long)(((iVar13 - iVar10) + 1) * ((iVar9 - iVar14) + 1)));
    if (iVar14 <= iVar9) {
      do {
        iVar20 = (int)uVar19;
        iVar15 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x580),iVar20);
        iVar14 = iVar10;
        if (iVar10 <= iVar13) {
          do {
            iVar16 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x588),iVar14);
            local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            plVar1 = *(long **)(lVar2 + 0x2f8);
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
            (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar16,iVar15,&local_d8);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_d8,&local_b8);
            QPersistentModelIndex::QPersistentModelIndex
                      ((QPersistentModelIndex *)&local_d8.i,(QPersistentModelIndex *)&local_d8);
            QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                      ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                       (QItemSelectionRange *)&local_d8);
            QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_d8.i);
            QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_d8);
            iVar14 = iVar14 + 1;
          } while (iVar13 + 1 != iVar14);
        }
        uVar19 = (ulong)(iVar20 + 1);
      } while (iVar20 != iVar9);
    }
  }
  else if (bVar5) {
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)&local_98,(long)((iVar9 - iVar14) + 1));
    if (iVar14 <= iVar9) {
      do {
        iVar13 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x580),(int)uVar19);
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar10,iVar13,&local_d8);
        local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_f0,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_d8,plVar1,local_120,iVar13,&local_f0);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0,&local_b8);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i,&local_d8)
        ;
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                   (QItemSelectionRange *)&local_f0);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0);
        uVar12 = (int)uVar19 + 1;
        uVar19 = (ulong)uVar12;
      } while (iVar9 + 1U != uVar12);
    }
  }
  else if (bVar4) {
    QList<QItemSelectionRange>::reserve
              ((QList<QItemSelectionRange> *)&local_98,(long)((iVar13 - iVar10) + 1));
    if (iVar10 <= iVar13) {
      do {
        iVar14 = QHeaderView::logicalIndex(*(QHeaderView **)(lVar2 + 0x588),iVar10);
        local_b8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_d8,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_b8,plVar1,iVar14,uVar19,&local_d8);
        local_d8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_d8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        plVar1 = *(long **)(lVar2 + 0x2f8);
        QPersistentModelIndex::operator_cast_to_QModelIndex
                  (&local_f0,(QPersistentModelIndex *)(lVar2 + 0x3b8));
        (**(code **)(*plVar1 + 0x60))(&local_d8,plVar1,iVar14,iVar9,&local_f0);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0,&local_b8);
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i,&local_d8)
        ;
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_98,local_98.size,
                   (QItemSelectionRange *)&local_f0);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_98);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_f0);
        iVar10 = iVar10 + 1;
      } while (iVar13 + 1 != iVar10);
    }
  }
  else {
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8,&local_58);
    QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i,&local_78);
    cVar7 = QItemSelectionRange::isEmpty();
    if (cVar7 == '\0') {
      QList<QItemSelectionRange>::append
                ((QList<QItemSelectionRange> *)&local_98,(parameter_type)&local_b8);
    }
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8.i);
    QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_b8);
  }
  (**(code **)(**(long **)(lVar2 + 0x328) + 0x70))
            (*(long **)(lVar2 + 0x328),&local_98,
             command.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
             super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
LAB_00594cc9:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSelection(const QRect &rect, QItemSelectionModel::SelectionFlags command)
{
    Q_D(QTableView);
    QModelIndex tl = indexAt(QPoint(isRightToLeft() ? qMax(rect.left(), rect.right())
                                    : qMin(rect.left(), rect.right()), qMin(rect.top(), rect.bottom())));
    QModelIndex br = indexAt(QPoint(isRightToLeft() ? qMin(rect.left(), rect.right()) :
                                    qMax(rect.left(), rect.right()), qMax(rect.top(), rect.bottom())));
    if (!d->selectionModel || !tl.isValid() || !br.isValid() || !d->isIndexEnabled(tl) || !d->isIndexEnabled(br))
        return;

    const bool verticalMoved = verticalHeader()->sectionsMoved();
    const bool horizontalMoved = horizontalHeader()->sectionsMoved();

    QItemSelection selection;
    int top = tl.row();
    int bottom = br.row();
    int left = tl.column();
    int right = br.column();

    if (d->hasSpans()) {
        bool expanded;
        // when the current selection does not intersect with any spans of merged cells,
        // the range of selected cells must be the same as if there were no merged cells
        bool intersectsSpan = false;
        top = qMin(d->visualRow(tl.row()), d->visualRow(br.row()));
        left = qMin(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        bottom = qMax(d->visualRow(tl.row()), d->visualRow(br.row()));
        right = qMax(d->visualColumn(tl.column()), d->visualColumn(br.column()));
        do {
            expanded = false;
            for (QSpanCollection::Span *it : d->spans.spans) {
                const QSpanCollection::Span &span = *it;
                const int t = d->visualRow(span.top());
                const int l = d->visualColumn(span.left());
                const int b = d->visualRow(d->rowSpanEndLogical(span.top(), span.height()));
                const int r = d->visualColumn(d->columnSpanEndLogical(span.left(), span.width()));
                if ((t > bottom) || (l > right) || (top > b) || (left > r))
                    continue; // no intersect
                intersectsSpan = true;
                if (t < top) {
                    top = t;
                    expanded = true;
                }
                if (l < left) {
                    left = l;
                    expanded = true;
                }
                if (b > bottom) {
                    bottom = b;
                    expanded = true;
                }
                if (r > right) {
                    right = r;
                    expanded = true;
                }
                if (expanded)
                    break;
            }
        } while (expanded);
        if (!intersectsSpan) {
            top = tl.row();
            bottom = br.row();
            left = tl.column();
            right = br.column();
        } else if (!verticalMoved && !horizontalMoved) {
            // top/left/bottom/right are visual, update indexes
            tl = d->model->index(top, left, d->root);
            br = d->model->index(bottom, right, d->root);
        }
    } else if (verticalMoved && horizontalMoved) {
         top = d->visualRow(tl.row());
         bottom = d->visualRow(br.row());
         left = d->visualColumn(tl.column());
         right = d->visualColumn(br.column());
    } else if (horizontalMoved) {
        top = tl.row();
        bottom = br.row();
        left = d->visualColumn(tl.column());
        right = d->visualColumn(br.column());
    } else if (verticalMoved) {
        top = d->visualRow(tl.row());
        bottom = d->visualRow(br.row());
        left = tl.column();
        right = br.column();
    }

    if (horizontalMoved && verticalMoved) {
         selection.reserve((right - left + 1) * (bottom - top + 1));
         for (int horizontal = left; horizontal <= right; ++horizontal) {
             int column = d->logicalColumn(horizontal);
             for (int vertical = top; vertical <= bottom; ++vertical) {
                 int row = d->logicalRow(vertical);
                 QModelIndex index = d->model->index(row, column, d->root);
                 selection.append(QItemSelectionRange(index));
             }
         }
    } else if (horizontalMoved) {
        selection.reserve(right - left + 1);
        for (int visual = left; visual <= right; ++visual) {
            int column = d->logicalColumn(visual);
            QModelIndex topLeft = d->model->index(top, column, d->root);
            QModelIndex bottomRight = d->model->index(bottom, column, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else if (verticalMoved) {
        selection.reserve(bottom - top + 1);
        for (int visual = top; visual <= bottom; ++visual) {
            int row = d->logicalRow(visual);
            QModelIndex topLeft = d->model->index(row, left, d->root);
            QModelIndex bottomRight = d->model->index(row, right, d->root);
            selection.append(QItemSelectionRange(topLeft, bottomRight));
        }
    } else { // nothing moved
        QItemSelectionRange range(tl, br);
        if (!range.isEmpty())
            selection.append(range);
    }

    d->selectionModel->select(selection, command);
}